

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::ExpressionBinder::Bind
          (ErrorData *__return_storage_ptr__,ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,idx_t depth,bool root_expression)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  pointer pPVar3;
  type pPVar4;
  pointer pEVar5;
  BaseExpression *this_00;
  BoundExpression *pBVar6;
  string alias;
  BindResult result;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_e8;
  idx_t local_e0;
  string local_d8 [8];
  long local_d0;
  BindResult local_b8;
  
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  local_e0 = (pPVar3->super_BaseExpression).query_location.index;
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(expr);
  ::std::__cxx11::string::string(local_d8,(string *)&(pPVar4->super_BaseExpression).alias);
  if ((pPVar4->super_BaseExpression).expression_class == BOUND_EXPRESSION) {
    ErrorData::ErrorData(__return_storage_ptr__);
  }
  else {
    (*this->_vptr_ExpressionBinder[5])(&local_b8,this,expr,depth,(ulong)root_expression);
    if (local_b8.error.initialized == true) {
      ErrorData::ErrorData(__return_storage_ptr__,&local_b8.error);
    }
    else {
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&local_b8.expression);
      (pEVar5->super_BaseExpression).query_location.index = local_e0;
      make_uniq<duckdb::BoundExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&local_e8,&local_b8.expression);
      _Var2._M_head_impl = local_e8._M_head_impl;
      local_e8._M_head_impl = (ParsedExpression *)0x0;
      _Var1._M_head_impl =
           (expr->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (expr->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        if (local_e8._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(expr)->super_BaseExpression;
      pBVar6 = BaseExpression::Cast<duckdb::BoundExpression>(this_00);
      ::std::__cxx11::string::_M_assign
                ((string *)&(pBVar6->super_ParsedExpression).super_BaseExpression.alias);
      if (local_d0 != 0) {
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pBVar6->expr);
        ::std::__cxx11::string::_M_assign((string *)&(pEVar5->super_BaseExpression).alias);
      }
      ErrorData::ErrorData(__return_storage_ptr__);
    }
    BindResult::~BindResult(&local_b8);
  }
  ::std::__cxx11::string::~string(local_d8);
  return __return_storage_ptr__;
}

Assistant:

ErrorData ExpressionBinder::Bind(unique_ptr<ParsedExpression> &expr, idx_t depth, bool root_expression) {
	// bind the node, but only if it has not been bound yet
	auto query_location = expr->GetQueryLocation();
	auto &expression = *expr;
	auto alias = expression.GetAlias();
	if (expression.GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION) {
		// already bound, don't bind it again
		return ErrorData();
	}
	// bind the expression
	BindResult result = BindExpression(expr, depth, root_expression);
	if (result.HasError()) {
		return std::move(result.error);
	}
	// successfully bound: replace the node with a BoundExpression
	result.expression->SetQueryLocation(query_location);
	expr = make_uniq<BoundExpression>(std::move(result.expression));
	auto &be = expr->Cast<BoundExpression>();
	be.SetAlias(alias);
	if (!alias.empty()) {
		be.expr->SetAlias(alias);
	}
	return ErrorData();
}